

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralCurveMember::~IfcStructuralCurveMember
          (IfcStructuralCurveMember *this,void **vtt)

{
  void *pvVar1;
  undefined1 *puVar2;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
              super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x2a];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject.field_0x88 = vtt[0x2b];
  (this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x2c];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject.field_0xd0 = vtt[0x2d];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.field_0x100
       = vtt[0x2e];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.field_0x110
       = vtt[0x2f];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.field_0x120 = vtt[0x30];
  puVar2 = *(undefined1 **)&(this->super_IfcStructuralMember).field_0x130;
  if (puVar2 != &this->field_0x140) {
    operator_delete(puVar2);
  }
  pvVar1 = vtt[4];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
              super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x10];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject.field_0x88 = vtt[0x11];
  (this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x12];
  puVar2 = *(undefined1 **)
            &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  if (puVar2 != &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
                 super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
                 field_0x20) {
    operator_delete(puVar2);
  }
  pvVar1 = vtt[6];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
              super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[9];
  puVar2 = *(undefined1 **)
            &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject.field_0x60;
  if (puVar2 != &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
                 super_IfcObject.field_0x70) {
    operator_delete(puVar2);
  }
  puVar2 = *(undefined1 **)
            &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject.field_0x38;
  if (puVar2 != &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
                 super_IfcObject.field_0x48) {
    operator_delete(puVar2);
  }
  puVar2 = *(undefined1 **)
            &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject.field_0x10;
  if (puVar2 != &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
                 super_IfcObject.field_0x20) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

IfcStructuralCurveMember() : Object("IfcStructuralCurveMember") {}